

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_measurement *
units::root(precise_measurement *__return_storage_ptr__,precise_measurement *pm,int power)

{
  double dVar1;
  precise_unit pVar2;
  precise_unit local_38;
  precise_unit local_28;
  int local_14;
  precise_measurement *ppStack_10;
  int power_local;
  precise_measurement *pm_local;
  
  local_14 = power;
  ppStack_10 = pm;
  dVar1 = precise_measurement::value(pm);
  dVar1 = numericalRoot<double>(dVar1,local_14);
  local_38 = precise_measurement::units(ppStack_10);
  pVar2 = root(&local_38,local_14);
  local_28._8_8_ = pVar2._8_8_;
  local_28.multiplier_ = pVar2.multiplier_;
  precise_measurement::precise_measurement(__return_storage_ptr__,dVar1,&local_28);
  return __return_storage_ptr__;
}

Assistant:

precise_measurement root(const precise_measurement& pm, int power)
{
    return {numericalRoot(pm.value(), power), root(pm.units(), power)};
}